

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::ImageT
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t width,size_t height,string *name)

{
  Col4<unsigned_char> *__s;
  ulong __n;
  
  Image::Image(&this->super_Image,width,height,name);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002adb80;
  __n = height * width * 4;
  __s = (Col4<unsigned_char> *)operator_new__(-(ulong)(height * width >> 0x3e != 0) | __n);
  this->data = __s;
  memset(__s,0,__n);
  return;
}

Assistant:

ImageT (size_t width = 0, size_t height = 0, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      memset((void*)data,0,width*height*sizeof(T));
    }